

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

ostream * Catch::TextFlow::operator<<(ostream *os,Column *col)

{
  size_type sVar1;
  bool bVar2;
  string line;
  iterator __begin2;
  char local_79;
  string local_78;
  iterator local_58;
  
  Column::iterator::iterator(&local_58,col);
  sVar1 = (col->m_string)._M_string_length;
  if ((local_58.m_pos != sVar1) || (local_58.m_column != col)) {
    bVar2 = true;
    do {
      Column::iterator::operator*[abi_cxx11_(&local_78,&local_58);
      if (bVar2) {
        bVar2 = false;
      }
      else {
        local_79 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_79,1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_78._M_dataplus._M_p,local_78._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      Column::iterator::operator++(&local_58);
    } while ((local_58.m_pos != sVar1) || (local_58.m_column != col));
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, Column const &col) {
            bool first = true;
            for (auto line : col) {
                if (first) {
                    first = false;
                }
                else {
                    os << '\n';
                }
                os << line;
            }
            return os;
        }